

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

DOHcode doh_decode(uchar *doh,size_t dohlen,DNStype dnstype,dohentry *d)

{
  byte bVar1;
  ushort rdlength;
  DOHcode DVar2;
  ushort uVar3;
  uint uVar4;
  ushort type;
  uint uVar5;
  size_t sVar6;
  uint index;
  undefined8 local_38;
  
  DVar2 = DOH_TOO_SMALL_BUFFER;
  if (0xb < dohlen) {
    local_38 = 4;
    DVar2 = DOH_DNS_BAD_ID;
    if ((((doh != (uchar *)0x0) && (*doh == '\0')) && (doh[1] == '\0')) &&
       (DVar2 = DOH_DNS_BAD_RCODE, (doh[3] & 0xf) == 0)) {
      sVar6 = 0xc;
      for (uVar3 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8; uVar3 != 0;
          uVar3 = uVar3 - 1) {
        do {
          uVar5 = (int)sVar6 + 1;
          if (dohlen < uVar5) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          bVar1 = doh[sVar6];
          if ((bVar1 & 0xc0) != 0) {
            if ((bVar1 & 0xc0) != 0xc0) {
              return DOH_DNS_BAD_LABEL;
            }
            uVar5 = (int)sVar6 + 2;
            if (dohlen < uVar5) {
              return DOH_DNS_OUT_OF_RANGE;
            }
            break;
          }
          uVar5 = uVar5 + bVar1;
          sVar6 = (size_t)uVar5;
          if (dohlen < sVar6) {
            return DOH_DNS_OUT_OF_RANGE;
          }
        } while (bVar1 != 0);
        sVar6 = (size_t)(uVar5 + 4);
        if (dohlen < sVar6) {
          return DOH_DNS_OUT_OF_RANGE;
        }
      }
      uVar3 = *(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8;
      if (uVar3 == 0) {
        local_38._4_4_ = 0;
      }
      else {
LAB_00491fe5:
        do {
          uVar5 = (int)sVar6 + 1;
          if (dohlen < uVar5) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          bVar1 = doh[sVar6];
          if ((bVar1 & 0xc0) == 0) {
            uVar5 = uVar5 + bVar1;
            if (dohlen < uVar5) {
              return DOH_DNS_OUT_OF_RANGE;
            }
            sVar6 = (size_t)uVar5;
            if (bVar1 != 0) goto LAB_00491fe5;
          }
          else {
            if ((bVar1 & 0xc0) != 0xc0) {
              return DOH_DNS_BAD_LABEL;
            }
            uVar5 = (int)sVar6 + 2;
            if (dohlen < uVar5) {
              return DOH_DNS_OUT_OF_RANGE;
            }
          }
          if (dohlen < uVar5 + 2) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          type = *(ushort *)(doh + (int)uVar5) << 8 | *(ushort *)(doh + (int)uVar5) >> 8;
          if (type != 5 && type != dnstype) {
            return DOH_DNS_UNEXPECTED_TYPE;
          }
          if (dohlen < uVar5 + 4) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          if ((ushort)(*(ushort *)(doh + (int)(uVar5 + 2)) << 8 |
                      *(ushort *)(doh + (int)(uVar5 + 2)) >> 8) != 1) {
            return DOH_DNS_UNEXPECTED_CLASS;
          }
          if (dohlen < uVar5 + 8) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          uVar4 = *(uint *)(doh + (int)(uVar5 + 4));
          uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          if (uVar4 < d->ttl) {
            d->ttl = uVar4;
          }
          uVar4 = uVar5 + 10;
          if (dohlen < uVar4) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          local_38._0_6_ = CONCAT24(type,(uint)local_38);
          rdlength = *(ushort *)(doh + (int)(uVar5 + 8)) << 8 |
                     *(ushort *)(doh + (int)(uVar5 + 8)) >> 8;
          sVar6 = (size_t)(uVar4 + rdlength);
          if (dohlen < sVar6) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          DVar2 = rdata(doh,dohlen,rdlength,type,uVar4,d);
          if (DVar2 != DOH_OK) {
            return DVar2;
          }
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        local_38._4_4_ = (uint)(local_38._4_2_ == 2);
      }
      local_38 = CONCAT44(local_38._4_4_,(int)sVar6);
      for (uVar3 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8; uVar3 != 0;
          uVar3 = uVar3 - 1) {
        DVar2 = skipqname(doh,dohlen,(uint *)&local_38);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        if (dohlen < (uint)local_38 + 8) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        if (dohlen < (uint)local_38 + 10) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uVar5 = (uint)(ushort)(*(ushort *)(doh + (int)((uint)local_38 + 8)) << 8 |
                              *(ushort *)(doh + (int)((uint)local_38 + 8)) >> 8) +
                (uint)local_38 + 10;
        sVar6 = (size_t)uVar5;
        if (dohlen < sVar6) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        local_38 = CONCAT44(local_38._4_4_,uVar5);
      }
      for (uVar3 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8; uVar3 != 0;
          uVar3 = uVar3 - 1) {
        DVar2 = skipqname(doh,dohlen,(uint *)&local_38);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        if (dohlen < (uint)local_38 + 8) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        if (dohlen < (uint)local_38 + 10) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uVar5 = (uint)(ushort)(*(ushort *)(doh + (int)((uint)local_38 + 8)) << 8 |
                              *(ushort *)(doh + (int)((uint)local_38 + 8)) >> 8) +
                (uint)local_38 + 10;
        sVar6 = (size_t)uVar5;
        if (dohlen < sVar6) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        local_38 = CONCAT44(local_38._4_4_,uVar5);
      }
      DVar2 = DOH_DNS_MALFORMAT;
      if (sVar6 == dohlen) {
        local_38._4_1_ = (char)((ulong)local_38 >> 0x20);
        if (((local_38._4_1_ == '\0') && (d->numcname == 0)) && (d->numaddr == 0)) {
          DVar2 = DOH_NO_CONTENT;
        }
        else {
          DVar2 = DOH_OK;
        }
      }
    }
  }
  return DVar2;
}

Assistant:

UNITTEST DOHcode doh_decode(unsigned char *doh,
                            size_t dohlen,
                            DNStype dnstype,
                            struct dohentry *d)
{
  unsigned char rcode;
  unsigned short qdcount;
  unsigned short ancount;
  unsigned short type = 0;
  unsigned short rdlength;
  unsigned short nscount;
  unsigned short arcount;
  unsigned int index = 12;
  DOHcode rc;

  if(dohlen < 12)
    return DOH_TOO_SMALL_BUFFER; /* too small */
  if(!doh || doh[0] || doh[1])
    return DOH_DNS_BAD_ID; /* bad ID */
  rcode = doh[3] & 0x0f;
  if(rcode)
    return DOH_DNS_BAD_RCODE; /* bad rcode */

  qdcount = get16bit(doh, 4);
  while(qdcount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */
    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;
    index += 4; /* skip question's type and class */
    qdcount--;
  }

  ancount = get16bit(doh, 6);
  while(ancount) {
    unsigned short class;
    unsigned int ttl;

    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    type = get16bit(doh, index);
    if((type != DNS_TYPE_CNAME) && (type != dnstype))
      /* Not the same type as was asked for nor CNAME */
      return DOH_DNS_UNEXPECTED_TYPE;
    index += 2;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;
    class = get16bit(doh, index);
    if(DNS_CLASS_IN != class)
      return DOH_DNS_UNEXPECTED_CLASS; /* unsupported */
    index += 2;

    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;

    ttl = get32bit(doh, index);
    if(ttl < d->ttl)
      d->ttl = ttl;
    index += 4;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;

    rc = rdata(doh, dohlen, rdlength, type, index, d);
    if(rc)
      return rc; /* bad rdata */
    index += rdlength;
    ancount--;
  }

  nscount = get16bit(doh, 8);
  while(nscount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    nscount--;
  }

  arcount = get16bit(doh, 10);
  while(arcount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    arcount--;
  }

  if(index != dohlen)
    return DOH_DNS_MALFORMAT; /* something is wrong */

  if((type != DNS_TYPE_NS) && !d->numcname && !d->numaddr)
    /* nothing stored! */
    return DOH_NO_CONTENT;

  return DOH_OK; /* ok */
}